

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O2

TranslatorInfo * __thiscall
helics::TranslatorFederate::getTranslatorInfo
          (TranslatorFederate *this,GlobalFederateId fed,InterfaceHandle handle)

{
  BaseType BVar1;
  TranslatorInfo *pTVar2;
  GlobalHandle local_8;
  
  BVar1 = (this->mFedID).gid;
  local_8.fed_id.gid = fed.gid;
  if ((this->mCoreID).gid == fed.gid) {
    local_8.fed_id.gid = BVar1;
  }
  if (fed.gid == 0) {
    local_8.fed_id.gid = BVar1;
  }
  local_8.handle.hid = handle.hid;
  pTVar2 = gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::find
                     (&this->translators,&local_8);
  return pTVar2;
}

Assistant:

TranslatorInfo* TranslatorFederate::getTranslatorInfo(GlobalFederateId fed, InterfaceHandle handle)
{
    if (fed == parent_broker_id || fed == mCoreID) {
        fed = mFedID;
    }
    return translators.find(GlobalHandle{fed, handle});
}